

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O1

void asmjit::v1_14::JitAllocatorImpl_deleteBlock
               (JitAllocatorPrivateImpl *impl,JitAllocatorBlock *block)

{
  if ((impl->allocationCount & 0x10) == 0) {
    VirtMem::release(*(void **)&impl->field_0x28,*(size_t *)&impl->pageSize);
  }
  else {
    VirtMem::releaseDualMapping((DualMapping *)&impl->field_0x28,*(size_t *)&impl->pageSize);
  }
  free(impl);
  return;
}

Assistant:

static void JitAllocatorImpl_deleteBlock(JitAllocatorPrivateImpl* impl, JitAllocatorBlock* block) noexcept {
  DebugUtils::unused(impl);

  if (block->hasFlag(JitAllocatorBlock::kFlagDualMapped))
    VirtMem::releaseDualMapping(&block->_mapping, block->blockSize());
  else
    VirtMem::release(block->rxPtr(), block->blockSize());

  ::free(block);
}